

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O3

void __thiscall TC_parser<true>::maybeFeature(TC_parser<true> *this)

{
  v_array<char> *pvVar1;
  float fVar2;
  byte bVar3;
  uchar uVar4;
  size_t sVar5;
  example *peVar6;
  char *_begin;
  char *pcVar7;
  features *pfVar8;
  unsigned_long *_begin_00;
  substring s;
  feature_index i;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  pointer ppvVar12;
  features **ppfVar13;
  ostream *poVar14;
  float *pfVar15;
  uint uVar16;
  undefined8 uVar17;
  ulong uVar18;
  byte *pbVar19;
  float *_begin_01;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  byte *pbVar23;
  TC_parser<true> *pTVar24;
  long lVar25;
  undefined8 uVar26;
  bool bVar27;
  float fVar28;
  substring sVar29;
  substring sVar30;
  substring feature_name;
  v_array<char> affix_v;
  undefined1 local_208 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  TC_parser<true> *local_1d8;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1d0;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  undefined1 local_1b8 [24];
  size_t sStack_1a0;
  ios_base local_138 [264];
  
  pbVar19 = (byte *)this->reading_head;
  bVar3 = *pbVar19;
  if (bVar3 == 9) {
    return;
  }
  if (bVar3 == 0x20) {
    return;
  }
  if (bVar3 == 0x7c) {
    return;
  }
  if (bVar3 == 0xd || pbVar19 == (byte *)this->endLine) {
    return;
  }
  lVar25 = 0;
  pbVar23 = pbVar19;
  while ((((0x3a < bVar3 || ((0x400000100000200U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) &&
          (bVar3 != 0x7c)) && ((pbVar23 != (byte *)this->endLine && (bVar3 != 0xd))))) {
    this->reading_head = (char *)(pbVar23 + 1);
    lVar25 = lVar25 + -1;
    bVar3 = pbVar23[1];
    pbVar23 = pbVar23 + 1;
  }
  fVar2 = this->cur_channel_v;
  local_1e8._M_allocated_capacity = (size_type)pbVar19;
  local_1e8._8_8_ = pbVar23;
  fVar28 = featureValue(this);
  fVar28 = fVar28 * fVar2;
  this->v = fVar28;
  if (lVar25 == 0) {
    sVar5 = this->anon;
    this->anon = sVar5 + 1;
    i = sVar5 + this->channel_hash;
  }
  else {
    sVar29.end = (char *)pbVar23;
    sVar29.begin = (char *)pbVar19;
    i = (*this->p->hasher)(sVar29,this->channel_hash);
    fVar28 = this->v;
  }
  if ((fVar28 == 0.0) && (!NAN(fVar28))) {
    return;
  }
  peVar6 = this->ae;
  bVar3 = this->index;
  features::push_back((peVar6->super_example_predict).feature_space + bVar3,fVar28,i);
  local_1b8._16_8_ = (char *)0x0;
  sStack_1a0 = 0;
  local_1b8._0_8_ = (char *)0x0;
  local_1b8._8_8_ = (char *)0x0;
  push_many<char>((v_array<char> *)local_1b8,(char *)pbVar19,-lVar25);
  local_208._0_8_ = local_208._0_8_ & 0xffffffffffffff00;
  v_array<char>::push_back((v_array<char> *)local_1b8,local_208);
  ppVar9 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)operator_new(0x40);
  local_1d8 = this;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<char_*&,_char_*&,_true>(ppVar9,&this->base,(char **)local_1b8);
  local_208._0_8_ = ppVar9;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8),ppVar9);
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back(&(peVar6->super_example_predict).feature_space[bVar3].space_names,
              (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208);
  pTVar24 = local_1d8;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
  }
  if ((char *)local_1b8._0_8_ != (char *)0x0) {
    free((void *)local_1b8._0_8_);
  }
  uVar18 = (ulong)pTVar24->index;
  uVar11 = pTVar24->affix_features[uVar18];
  if ((uVar11 != 0) && (local_1e8._8_8_ != local_1e8._M_allocated_capacity)) {
    peVar6 = pTVar24->ae;
    if ((peVar6->super_example_predict).feature_space[0x84].values._end ==
        (peVar6->super_example_predict).feature_space[0x84].values._begin) {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar6,&affix_namespace);
      uVar18 = (ulong)pTVar24->index;
      uVar11 = pTVar24->affix_features[uVar18];
      if (uVar11 == 0) goto LAB_0026bfac;
    }
    local_1d0 = &(peVar6->super_example_predict).feature_space[0x84].space_names;
    do {
      pTVar24 = local_1d8;
      uVar16 = (uint)(uVar11 >> 1) & 7;
      pbVar19 = (byte *)(local_1e8._M_allocated_capacity + uVar16);
      uVar17 = (byte *)(local_1e8._8_8_ - (ulong)uVar16);
      if ((ulong)local_1e8._8_8_ <= pbVar19) {
        uVar17 = local_1e8._M_allocated_capacity;
      }
      uVar26 = local_1e8._8_8_;
      if ((uVar11 & 1) != 0) {
        uVar26 = pbVar19;
        uVar17 = local_1e8._M_allocated_capacity;
      }
      if ((ulong)local_1e8._8_8_ <= pbVar19) {
        uVar26 = local_1e8._8_8_;
      }
      sVar30.end = (char *)uVar26;
      sVar30.begin = (char *)uVar17;
      uVar10 = (*local_1d8->p->hasher)(sVar30,local_1d8->channel_hash);
      features::push_back((peVar6->super_example_predict).feature_space + 0x84,pTVar24->v,
                          ((ulong)((uint)uVar11 & 0xf) * 0x1aa5cfd + 0xd42855) * uVar10);
      local_1b8._16_8_ = (char *)0x0;
      sStack_1a0 = 0;
      local_1b8._0_8_ = (char *)0x0;
      local_1b8._8_8_ = (char *)0x0;
      uVar4 = pTVar24->index;
      if (uVar4 != ' ') {
        local_208[0] = uVar4;
        v_array<char>::push_back((v_array<char> *)local_1b8,(char *)local_208);
      }
      local_208[0] = ((uVar11 & 1) == 0) * '\x02' + '+';
      v_array<char>::push_back((v_array<char> *)local_1b8,(char *)local_208);
      local_208[0] = (byte)uVar16 | 0x30;
      v_array<char>::push_back((v_array<char> *)local_1b8,(char *)local_208);
      local_208[0] = '=';
      v_array<char>::push_back((v_array<char> *)local_1b8,(char *)local_208);
      push_many<char>((v_array<char> *)local_1b8,(char *)uVar17,uVar26 - uVar17);
      local_208._0_8_ = (ulong)(uint7)local_208._1_7_ << 8;
      v_array<char>::push_back((v_array<char> *)local_1b8,(char *)local_208);
      ppVar9 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x40);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[6],_char_*&,_true>(ppVar9,(char (*) [6])"affix",(char **)local_1b8);
      local_208._0_8_ = ppVar9;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8),ppVar9);
      v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(local_1d0,
                  (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_208);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
      }
      bVar27 = 0xf < uVar11;
      uVar11 = uVar11 >> 4;
    } while (bVar27);
    uVar18 = (ulong)local_1d8->index;
    pTVar24 = local_1d8;
  }
LAB_0026bfac:
  if (pTVar24->spelling_features[uVar18] == true) {
    peVar6 = pTVar24->ae;
    if ((peVar6->super_example_predict).feature_space[0x85].values._end ==
        (peVar6->super_example_predict).feature_space[0x85].values._begin) {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)peVar6,&spelling_namespace);
    }
    v_array<char>::clear(&pTVar24->spelling);
    if (local_1e8._M_allocated_capacity != local_1e8._8_8_) {
      uVar17 = local_1e8._M_allocated_capacity;
      do {
        bVar3 = *(byte *)uVar17;
        if ((byte)(bVar3 - 0x30) < 10) {
          local_1b8[0] = 0x30;
        }
        else if ((byte)(bVar3 + 0x9f) < 0x1a) {
          local_1b8[0] = 0x61;
        }
        else if ((byte)(bVar3 + 0xbf) < 0x1a) {
          local_1b8[0] = 0x41;
        }
        else if (bVar3 == 0x2e) {
          local_1b8[0] = 0x2e;
        }
        else {
          local_1b8[0] = 0x23;
        }
        v_array<char>::push_back(&pTVar24->spelling,local_1b8);
        uVar17 = uVar17 + 1;
      } while (uVar17 != local_1e8._8_8_);
    }
    pTVar24 = local_1d8;
    pvVar1 = &local_1d8->spelling;
    _begin = pvVar1->_begin;
    pcVar7 = (local_1d8->spelling)._end;
    s.begin = pvVar1->_begin;
    s.end = pvVar1->_end;
    uVar11 = hashstring(s,local_1d8->channel_hash);
    features::push_back((peVar6->super_example_predict).feature_space + 0x85,pTVar24->v,uVar11);
    local_1b8._16_8_ = (char *)0x0;
    sStack_1a0 = 0;
    local_1b8._0_8_ = (char *)0x0;
    local_1b8._8_8_ = (char *)0x0;
    uVar4 = pTVar24->index;
    if (uVar4 != ' ') {
      local_208[0] = uVar4;
      v_array<char>::push_back((v_array<char> *)local_1b8,local_208);
      local_208[0] = 0x5f;
      v_array<char>::push_back((v_array<char> *)local_1b8,local_208);
    }
    push_many<char>((v_array<char> *)local_1b8,_begin,(long)pcVar7 - (long)_begin);
    local_208._0_8_ = local_208._0_8_ & 0xffffffffffffff00;
    v_array<char>::push_back((v_array<char> *)local_1b8,local_208);
    ppVar9 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)operator_new(0x40);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[9],_char_*&,_true>(ppVar9,(char (*) [9])"spelling",(char **)local_1b8);
    local_208._0_8_ = ppVar9;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8),ppVar9);
    v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&(peVar6->super_example_predict).feature_space[0x85].space_names,
                (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_208);
    pTVar24 = local_1d8;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
    uVar18 = (ulong)pTVar24->index;
  }
  ppvVar12 = pTVar24->namespace_dictionaries[uVar18].
             super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar24->namespace_dictionaries[uVar18].
      super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppvVar12) {
    local_1d0 = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)0x0;
    do {
      uVar16 = (int)local_1e8._8_8_ - (int)local_1e8._M_allocated_capacity;
      uVar20 = uVar16;
      if ((int)uVar16 < 0) {
        uVar20 = uVar16 + 3;
      }
      pbVar19 = (byte *)((long)(int)(uVar20 & 0xfffffffc) + local_1e8._M_allocated_capacity);
      uVar22 = 0x1aa5cfd;
      if (6 < uVar16 + 3) {
        lVar25 = (long)-((int)uVar20 >> 2);
        do {
          uVar22 = ((uint)(*(int *)(pbVar19 + lVar25 * 4) * -0x3361d2af) >> 0x11 |
                   *(int *)(pbVar19 + lVar25 * 4) * 0x16a88000) * 0x1b873593 ^ uVar22;
          uVar22 = (uVar22 << 0xd | uVar22 >> 0x13) * 5 + 0xe6546b64;
          lVar25 = lVar25 + 1;
        } while (lVar25 != 0);
      }
      uVar21 = 0;
      uVar20 = 0;
      switch(uVar16 & 3) {
      case 3:
        uVar20 = (uint)pbVar19[2] << 0x10;
      case 2:
        uVar21 = uVar20 | (uint)pbVar19[1] << 8;
      case 1:
        uVar22 = uVar22 ^ ((*pbVar19 ^ uVar21) * -0x3361d2af >> 0x11 |
                          (*pbVar19 ^ uVar21) * 0x16a88000) * 0x1b873593;
      }
      uVar16 = ((uVar22 ^ uVar16) >> 0x10 ^ uVar22 ^ uVar16) * -0x7a143595;
      uVar16 = (uVar16 >> 0xd ^ uVar16) * -0x3d4d51cb;
      ppfVar13 = v_hashmap<substring,_features_*>::get
                           (ppvVar12[(long)local_1d0],(substring *)&local_1e8,
                            (ulong)(uVar16 >> 0x10 ^ uVar16));
      pfVar8 = *ppfVar13;
      if (pfVar8 != (features *)0x0) {
        _begin_01 = (pfVar8->values)._begin;
        pfVar15 = (pfVar8->values)._end;
        if (pfVar15 != _begin_01) {
          peVar6 = pTVar24->ae;
          if ((peVar6->super_example_predict).feature_space[0x87].values._end ==
              (peVar6->super_example_predict).feature_space[0x87].values._begin) {
            v_array<unsigned_char>::push_back
                      ((v_array<unsigned_char> *)peVar6,&dictionary_namespace);
            _begin_01 = (pfVar8->values)._begin;
            pfVar15 = (pfVar8->values)._end;
          }
          push_many<float>(&(peVar6->super_example_predict).feature_space[0x87].values,_begin_01,
                           (long)pfVar15 - (long)_begin_01 >> 2);
          _begin_00 = (pfVar8->indicies)._begin;
          push_many<unsigned_long>
                    (&(peVar6->super_example_predict).feature_space[0x87].indicies,_begin_00,
                     (long)(pfVar8->indicies)._end - (long)_begin_00 >> 3);
          (peVar6->super_example_predict).feature_space[0x87].sum_feat_sq =
               pfVar8->sum_feat_sq + (peVar6->super_example_predict).feature_space[0x87].sum_feat_sq
          ;
          if ((pfVar8->indicies)._end != (pfVar8->indicies)._begin) {
            uVar18 = 0;
            do {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              local_208[0] = pTVar24->index;
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_1b8 + 0x10),(char *)local_208,1);
              local_208[0] = 0x5f;
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)local_208,1);
              for (uVar17 = local_1e8._M_allocated_capacity; uVar17 != local_1e8._8_8_;
                  uVar17 = uVar17 + 1) {
                local_208[0] = *(byte *)uVar17;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_1b8 + 0x10),(char *)local_208,1);
              }
              local_208[0] = 0x3d;
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_1b8 + 0x10),(char *)local_208,1);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
              ppVar9 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)operator_new(0x40);
              std::__cxx11::stringbuf::str();
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        (ppVar9,(char (*) [11])0x27279a,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_208);
              local_1c8.
              super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = ppVar9;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                        (&local_1c8.
                          super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,ppVar9);
              v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::push_back(&(peVar6->super_example_predict).feature_space[0x87].space_names,
                          &local_1c8);
              pTVar24 = local_1d8;
              if (local_1c8.
                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_1c8.
                           super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_208._0_8_ !=
                  (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_208 + 0x10)) {
                operator_delete((void *)local_208._0_8_);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              std::ios_base::~ios_base(local_138);
              uVar18 = uVar18 + 1;
            } while (uVar18 < (ulong)((long)(pfVar8->indicies)._end -
                                      (long)(pfVar8->indicies)._begin >> 3));
          }
        }
      }
      local_1d0 = (v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)local_1d0 + 1);
      ppvVar12 = pTVar24->namespace_dictionaries[pTVar24->index].
                 super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (local_1d0 <
             (ulong)((long)pTVar24->namespace_dictionaries[pTVar24->index].
                           super__Vector_base<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar12 >> 3));
  }
  return;
}

Assistant:

inline void maybeFeature()
  {
    if (*reading_head == ' ' || *reading_head == '\t' || *reading_head == '|' || reading_head == endLine ||
        *reading_head == '\r')
    {
      // maybeFeature --> ø
    }
    else
    {
      // maybeFeature --> 'String' FeatureValue
      substring feature_name = read_name();
      v = cur_channel_v * featureValue();
      uint64_t word_hash;
      if (feature_name.end != feature_name.begin)
        word_hash = (p->hasher(feature_name, channel_hash));
      else
        word_hash = channel_hash + anon++;
      if (v == 0)
        return;  // dont add 0 valued features to list of features
      features& fs = ae->feature_space[index];
      fs.push_back(v, word_hash);
      if (audit)
      {
        v_array<char> feature_v = v_init<char>();
        push_many(feature_v, feature_name.begin, feature_name.end - feature_name.begin);
        feature_v.push_back('\0');
        fs.space_names.push_back(audit_strings_ptr(new audit_strings(base, feature_v.begin())));
        feature_v.delete_v();
      }
      if ((affix_features[index] > 0) && (feature_name.end != feature_name.begin))
      {
        features& affix_fs = ae->feature_space[affix_namespace];
        if (affix_fs.size() == 0)
          ae->indices.push_back(affix_namespace);
        uint64_t affix = affix_features[index];
        while (affix > 0)
        {
          bool is_prefix = affix & 0x1;
          uint64_t len = (affix >> 1) & 0x7;
          substring affix_name = {feature_name.begin, feature_name.end};
          if (affix_name.end > affix_name.begin + len)
          {
            if (is_prefix)
              affix_name.end = affix_name.begin + len;
            else
              affix_name.begin = affix_name.end - len;
          }
          word_hash =
              p->hasher(affix_name, (uint64_t)channel_hash) * (affix_constant + (affix & 0xF) * quadratic_constant);
          affix_fs.push_back(v, word_hash);
          if (audit)
          {
            v_array<char> affix_v = v_init<char>();
            if (index != ' ')
              affix_v.push_back(index);
            affix_v.push_back(is_prefix ? '+' : '-');
            affix_v.push_back('0' + (char)len);
            affix_v.push_back('=');
            push_many(affix_v, affix_name.begin, affix_name.end - affix_name.begin);
            affix_v.push_back('\0');
            affix_fs.space_names.push_back(audit_strings_ptr(new audit_strings("affix", affix_v.begin())));
          }
          affix >>= 4;
        }
      }
      if (spelling_features[index])
      {
        features& spell_fs = ae->feature_space[spelling_namespace];
        if (spell_fs.size() == 0)
          ae->indices.push_back(spelling_namespace);
        // v_array<char> spelling;
        spelling.clear();
        for (char* c = feature_name.begin; c != feature_name.end; ++c)
        {
          char d = 0;
          if ((*c >= '0') && (*c <= '9'))
            d = '0';
          else if ((*c >= 'a') && (*c <= 'z'))
            d = 'a';
          else if ((*c >= 'A') && (*c <= 'Z'))
            d = 'A';
          else if (*c == '.')
            d = '.';
          else
            d = '#';
          // if ((spelling.size() == 0) || (spelling.last() != d))
          spelling.push_back(d);
        }
        substring spelling_ss = {spelling.begin(), spelling.end()};
        uint64_t word_hash = hashstring(spelling_ss, (uint64_t)channel_hash);
        spell_fs.push_back(v, word_hash);
        if (audit)
        {
          v_array<char> spelling_v = v_init<char>();
          if (index != ' ')
          {
            spelling_v.push_back(index);
            spelling_v.push_back('_');
          }
          push_many(spelling_v, spelling_ss.begin, spelling_ss.end - spelling_ss.begin);
          spelling_v.push_back('\0');
          spell_fs.space_names.push_back(audit_strings_ptr(new audit_strings("spelling", spelling_v.begin())));
        }
      }
      if (namespace_dictionaries[index].size() > 0)
      {
        for (size_t dict = 0; dict < namespace_dictionaries[index].size(); dict++)
        {
          feature_dict* map = namespace_dictionaries[index][dict];
          uint64_t hash = uniform_hash(feature_name.begin, feature_name.end - feature_name.begin, quadratic_constant);
          features* feats = map->get(feature_name, hash);
          if ((feats != nullptr) && (feats->values.size() > 0))
          {
            features& dict_fs = ae->feature_space[dictionary_namespace];
            if (dict_fs.size() == 0)
              ae->indices.push_back(dictionary_namespace);
            push_many(dict_fs.values, feats->values.begin(), feats->values.size());
            push_many(dict_fs.indicies, feats->indicies.begin(), feats->indicies.size());
            dict_fs.sum_feat_sq += feats->sum_feat_sq;
            if (audit)
              for (size_t i = 0; i < feats->indicies.size(); ++i)
              {
                uint64_t id = feats->indicies[i];
                stringstream ss;
                ss << index << '_';
                for (char* fc = feature_name.begin; fc != feature_name.end; ++fc) ss << *fc;
                ss << '=' << id;
                dict_fs.space_names.push_back(audit_strings_ptr(new audit_strings("dictionary", ss.str())));
              }
          }
        }
      }
    }
  }